

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

void quaternion_get_euler_anglesf3(quaternion *self,float *ax,float *ay,float *az)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float qw;
  float qz;
  float qy;
  float qx;
  float *az_local;
  float *ay_local;
  float *ax_local;
  quaternion *self_local;
  
  fVar1 = (self->field_0).q[3];
  fVar2 = (self->field_0).q[0];
  fVar3 = (self->field_0).q[1];
  fVar4 = (self->field_0).q[2];
  dVar5 = atan2((double)(fVar3 * fVar4 + fVar1 * fVar2),
                (double)(0.5 - (fVar2 * fVar2 + fVar3 * fVar3)));
  *ax = (float)dVar5;
  dVar5 = asin((double)((fVar2 * fVar4 + -(fVar1 * fVar3)) * -2.0));
  *ay = (float)dVar5;
  dVar5 = atan2((double)(fVar2 * fVar3 + fVar1 * fVar4),
                (double)(0.5 - (fVar3 * fVar3 + fVar4 * fVar4)));
  *az = (float)dVar5;
  return;
}

Assistant:

HYPAPI void quaternion_get_euler_anglesf3(const struct quaternion *self, HYP_FLOAT *ax, HYP_FLOAT *ay, HYP_FLOAT *az)
{
	HYP_FLOAT qx, qy, qz, qw;

	qw = self->w;
	qx = self->x;
	qy = self->y;
	qz = self->z;

	*ax = HYP_ATAN2(qy * qz + qw * qx, 0.5f - ((qx * qx) + (qy * qy)));
	*ay = HYP_ASIN(-2.0f * ((qx * qz) - (qw * qy)));
	*az = HYP_ATAN2(((qx * qy) + (qw * qz)), 0.5f - ((qy * qy) + (qz * qz)));
}